

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void labelcolor_cb(Fl_Button *i,void *v)

{
  bool bVar1;
  Fl_Color FVar2;
  int iVar3;
  Fl_Widget_Type *q;
  Fl_Type *o;
  Fl_Color d;
  int mod;
  Fl_Color c;
  void *v_local;
  Fl_Button *i_local;
  
  FVar2 = Fl_Widget::labelcolor(current_widget->o);
  d = FVar2;
  if ((char *)v != "LOAD") {
    bVar1 = false;
    d = fl_show_colormap(FVar2);
    if (d == FVar2) {
      return;
    }
    for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
        q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
      if (((q->super_Fl_Type).selected != '\0') &&
         (iVar3 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar3 != 0)) {
        Fl_Widget::labelcolor(q->o,d);
        Fl_Widget_Type::redraw(q);
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  Fl_Widget::color(&i->super_Fl_Widget,d);
  FVar2 = fl_contrast(0x38,d);
  Fl_Widget::labelcolor(&i->super_Fl_Widget,FVar2);
  Fl_Widget::redraw(&i->super_Fl_Widget);
  return;
}

Assistant:

void labelcolor_cb(Fl_Button* i, void *v) {
  Fl_Color c = current_widget->o->labelcolor();
  if (v != LOAD) {
    int mod = 0;
    Fl_Color d = fl_show_colormap(c);
    if (d == c) return;
    c = d;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->labelcolor(c); q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->color(c); i->labelcolor(fl_contrast(FL_BLACK,c)); i->redraw();
}